

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void load256i128(uint16_t *out,secp256k1_int128 *v)

{
  undefined8 in_RDX;
  uint64_t lo;
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2._0_4_ = (int)(short)v;
  auVar2._4_4_ = (int)(short)((ulong)v >> 0x10);
  auVar2._8_4_ = (int)(short)((ulong)v >> 0x20);
  auVar2._12_4_ = (int)(short)((ulong)v >> 0x30);
  auVar3._0_4_ = (int)(short)in_RDX;
  auVar3._4_4_ = (int)(short)((ulong)in_RDX >> 0x10);
  auVar3._8_4_ = (int)(short)((ulong)in_RDX >> 0x20);
  auVar3._12_4_ = (int)(short)((ulong)in_RDX >> 0x30);
  auVar2 = packssdw(auVar2,auVar3);
  *(undefined1 (*) [16])out = auVar2;
  auVar2 = ZEXT416((uint)((long)in_RDX >> 0x3f));
  auVar2 = pshuflw(auVar2,auVar2,0);
  uVar1 = auVar2._0_4_;
  *(undefined4 *)(out + 8) = uVar1;
  *(undefined4 *)(out + 10) = uVar1;
  *(undefined4 *)(out + 0xc) = uVar1;
  *(undefined4 *)(out + 0xe) = uVar1;
  return;
}

Assistant:

static void load256two64(uint16_t* out, uint64_t hi, uint64_t lo, int is_signed) {
    int i;
    uint64_t sign = is_signed && (hi >> 63) ? UINT64_MAX : 0;
    for (i = 0; i < 4; ++i) {
        out[i] = lo >> (16 * i);
    }
    for (i = 4; i < 8; ++i) {
        out[i] = hi >> (16 * (i - 4));
    }
    for (i = 8; i < 16; ++i) {
        out[i] = sign;
    }
}